

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall Hospital::Validate_username_password(Hospital *this,string *user,string *pass)

{
  bool bVar1;
  ostream *poVar2;
  string *pass_local;
  string *user_local;
  Hospital *this_local;
  
  bVar1 = std::operator!=(user,&this->Admin_Username);
  if ((!bVar1) && (bVar1 = std::operator!=(pass,&this->Admin_Password), !bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"You entered successfully ...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return true;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"your Username or Password is incorrect !!! ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool Hospital ::Validate_username_password(string user , string pass){
    if ((user != Admin_Username) || (pass != Admin_Password)){
        cout << "your Username or Password is incorrect !!! "<<endl;
        return false;
    }
    else {
        cout << "You entered successfully ..." << endl;
        return true;
    }
}